

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O2

float orient2dslow(float *pa,float *pb,float *pc)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float deter [16];
  float local_48;
  float local_44;
  float fStack_40;
  float fStack_3c;
  float fStack_38;
  undefined8 local_34;
  float local_2c;
  float local_28;
  float local_24;
  float fStack_20;
  float fStack_1c;
  float fStack_18;
  undefined8 local_14;
  float local_c;
  
  fVar4 = *pa;
  fVar6 = pa[1];
  fVar3 = *pc;
  fVar8 = pc[1];
  fVar5 = fVar4 - fVar3;
  fVar13 = (fVar4 - (fVar5 + (fVar4 - fVar5))) + ((fVar4 - fVar5) - fVar3);
  fVar7 = fVar6 - fVar8;
  fVar2 = (fVar6 - (fVar7 + (fVar6 - fVar7))) + ((fVar6 - fVar7) - fVar8);
  fVar4 = *pb;
  fVar6 = pb[1];
  fVar9 = fVar4 - fVar3;
  fVar3 = (fVar4 - (fVar9 + (fVar4 - fVar9))) + ((fVar4 - fVar9) - fVar3);
  fVar4 = fVar6 - fVar8;
  fVar8 = (fVar6 - (fVar4 + (fVar6 - fVar4))) + ((fVar6 - fVar4) - fVar8);
  fVar10 = splitter * fVar13 - (splitter * fVar13 - fVar13);
  fVar15 = fVar13 - fVar10;
  fVar11 = fVar5 * splitter - (fVar5 * splitter - fVar5);
  fVar12 = fVar5 - fVar11;
  fVar19 = splitter * fVar8 - (splitter * fVar8 - fVar8);
  fVar21 = splitter * fVar4 - (splitter * fVar4 - fVar4);
  fVar14 = fVar13 * fVar8;
  fVar13 = fVar13 * fVar4;
  fVar6 = fVar5 * fVar8;
  fVar5 = fVar5 * fVar4;
  fVar8 = fVar8 - fVar19;
  fVar4 = fVar4 - fVar21;
  local_28 = fVar15 * fVar8 - (((fVar14 - fVar10 * fVar19) - fVar15 * fVar19) - fVar10 * fVar8);
  fVar8 = fVar12 * fVar8 - (((fVar6 - fVar11 * fVar19) - fVar12 * fVar19) - fVar11 * fVar8);
  fVar19 = fVar12 * fVar4 - (((fVar5 - fVar11 * fVar21) - fVar12 * fVar21) - fVar11 * fVar4);
  fVar17 = fVar14 + fVar8;
  fVar18 = fVar13 + fVar19;
  fVar12 = fVar6 + fVar17;
  fVar6 = fVar17 - (fVar12 - fVar6);
  fVar11 = fVar4 * fVar15 - (((fVar13 - fVar10 * fVar21) - fVar21 * fVar15) - fVar10 * fVar4);
  fVar17 = (fVar14 - (fVar17 - (fVar17 - fVar14))) + (fVar8 - (fVar17 - fVar14));
  fVar21 = (fVar13 - (fVar18 - (fVar18 - fVar13))) + (fVar19 - (fVar18 - fVar13));
  fVar15 = fVar11 + fVar17;
  fVar4 = fVar6 + fVar15;
  fVar6 = (fVar6 - (fVar4 - (fVar4 - fVar6))) + (fVar15 - (fVar4 - fVar6));
  fVar8 = fVar12 + fVar4;
  fVar10 = (fVar12 - (fVar8 - (fVar8 - fVar12))) + (fVar4 - (fVar8 - fVar12));
  fVar20 = fVar21 + fVar6;
  fVar4 = fVar10 + fVar20;
  fVar14 = (fVar10 - (fVar4 - (fVar4 - fVar10))) + (fVar20 - (fVar4 - fVar10));
  fVar16 = fVar8 + fVar4;
  fVar12 = (fVar8 - (fVar16 - (fVar16 - fVar8))) + (fVar4 - (fVar16 - fVar8));
  fVar10 = fVar5 + fVar18;
  fVar8 = (fVar5 - (fVar10 - (fVar10 - fVar5))) + (fVar18 - (fVar10 - fVar5));
  fVar5 = fVar8 + fVar14;
  fVar4 = fVar12 + fVar5;
  fVar19 = (fVar12 - (fVar4 - (fVar4 - fVar12))) + (fVar5 - (fVar4 - fVar12));
  fVar13 = fVar19 + fVar10;
  fVar12 = fVar16 + fVar4;
  fVar16 = (fVar16 - (fVar12 - (fVar12 - fVar16))) + (fVar4 - (fVar12 - fVar16));
  local_24 = (fVar11 - (fVar15 - fVar17)) + (fVar17 - (fVar15 - (fVar15 - fVar17)));
  fStack_20 = (fVar6 - (fVar20 - (fVar20 - fVar6))) + (fVar21 - (fVar20 - fVar6));
  fStack_1c = (fVar14 - (fVar5 - (fVar5 - fVar14))) + (fVar8 - (fVar5 - fVar14));
  fStack_18 = (fVar19 - (fVar13 - (fVar13 - fVar19))) + (fVar10 - (fVar13 - fVar19));
  fVar4 = fVar16 + fVar13;
  local_c = fVar12 + fVar4;
  local_14 = CONCAT44((fVar12 - (local_c - (local_c - fVar12))) + (fVar4 - (local_c - fVar12)),
                      (fVar16 - (fVar4 - (fVar4 - fVar16))) + (fVar13 - (fVar4 - fVar16)));
  fVar8 = splitter * fVar3 - (splitter * fVar3 - fVar3);
  fVar12 = fVar3 - fVar8;
  fVar11 = fVar9 * splitter - (fVar9 * splitter - fVar9);
  fVar4 = -fVar2;
  fVar6 = -fVar7;
  fVar10 = fVar9 - fVar11;
  fVar2 = splitter * fVar4 - (splitter * fVar4 + fVar2);
  fVar5 = splitter * fVar6 - (fVar7 + splitter * fVar6);
  fVar13 = fVar3 * fVar4;
  fVar3 = fVar3 * fVar6;
  fVar14 = fVar9 * fVar4;
  fVar9 = fVar9 * fVar6;
  fVar4 = fVar4 - fVar2;
  fVar6 = fVar6 - fVar5;
  local_48 = fVar12 * fVar4 - (((fVar13 - fVar8 * fVar2) - fVar12 * fVar2) - fVar8 * fVar4);
  fVar4 = fVar10 * fVar4 - (((fVar14 - fVar11 * fVar2) - fVar10 * fVar2) - fVar11 * fVar4);
  fVar7 = fVar10 * fVar6 - (((fVar9 - fVar11 * fVar5) - fVar10 * fVar5) - fVar11 * fVar6);
  fVar11 = fVar13 + fVar4;
  fVar19 = fVar3 + fVar7;
  fVar2 = fVar14 + fVar11;
  fVar10 = fVar11 - (fVar2 - fVar14);
  fVar8 = fVar6 * fVar12 - (((fVar3 - fVar8 * fVar5) - fVar5 * fVar12) - fVar8 * fVar6);
  fVar14 = (fVar13 - (fVar11 - (fVar11 - fVar13))) + (fVar4 - (fVar11 - fVar13));
  fVar15 = (fVar3 - (fVar19 - (fVar19 - fVar3))) + (fVar7 - (fVar19 - fVar3));
  fVar5 = fVar8 + fVar14;
  fVar4 = fVar10 + fVar5;
  fVar7 = (fVar10 - (fVar4 - (fVar4 - fVar10))) + (fVar5 - (fVar4 - fVar10));
  fVar6 = fVar2 + fVar4;
  fVar3 = (fVar2 - (fVar6 - (fVar6 - fVar2))) + (fVar4 - (fVar6 - fVar2));
  fVar12 = fVar15 + fVar7;
  fVar4 = fVar3 + fVar12;
  fVar2 = (fVar3 - (fVar4 - (fVar4 - fVar3))) + (fVar12 - (fVar4 - fVar3));
  fVar10 = fVar6 + fVar4;
  fVar4 = (fVar6 - (fVar10 - (fVar10 - fVar6))) + (fVar4 - (fVar10 - fVar6));
  fVar13 = fVar9 + fVar19;
  fVar9 = (fVar9 - (fVar13 - (fVar13 - fVar9))) + (fVar19 - (fVar13 - fVar9));
  fVar19 = fVar9 + fVar2;
  fVar11 = fVar4 + fVar19;
  fVar4 = (fVar4 - (fVar11 - (fVar11 - fVar4))) + (fVar19 - (fVar11 - fVar4));
  fVar6 = fVar4 + fVar13;
  fVar3 = fVar10 + fVar11;
  fVar10 = (fVar10 - (fVar3 - (fVar3 - fVar10))) + (fVar11 - (fVar3 - fVar10));
  local_44 = (fVar8 - (fVar5 - fVar14)) + (fVar14 - (fVar5 - (fVar5 - fVar14)));
  fStack_40 = (fVar7 - (fVar12 - (fVar12 - fVar7))) + (fVar15 - (fVar12 - fVar7));
  fStack_3c = (fVar2 - (fVar19 - (fVar19 - fVar2))) + (fVar9 - (fVar19 - fVar2));
  fStack_38 = (fVar4 - (fVar6 - (fVar6 - fVar4))) + (fVar13 - (fVar6 - fVar4));
  fVar4 = fVar10 + fVar6;
  local_2c = fVar3 + fVar4;
  local_34 = CONCAT44((fVar3 - (local_2c - (local_2c - fVar3))) + (fVar4 - (local_2c - fVar3)),
                      (fVar10 - (fVar4 - (fVar4 - fVar10))) + (fVar6 - (fVar4 - fVar10)));
  iVar1 = fast_expansion_sum_zeroelim(8,&local_28,8,&local_48,deter);
  return deter[(long)iVar1 + -1];
}

Assistant:

REAL orient2dslow(pa, pb, pc)
REAL *pa;
REAL *pb;
REAL *pc;
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail;
  REAL bcxtail, bcytail;
  REAL negate, negatetail;
  REAL axby[8], bxay[8];
  INEXACT REAL axby7, bxay7;
  REAL deter[16];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pc[0], acx, acxtail);
  Two_Diff(pa[1], pc[1], acy, acytail);
  Two_Diff(pb[0], pc[0], bcx, bcxtail);
  Two_Diff(pb[1], pc[1], bcy, bcytail);

  Two_Two_Product(acx, acxtail, bcy, bcytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -acy;
  negatetail = -acytail;
  Two_Two_Product(bcx, bcxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;

  deterlen = fast_expansion_sum_zeroelim(8, axby, 8, bxay, deter);

  return deter[deterlen - 1];
}